

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-power.c
# Opt level: O0

wchar_t effects_power(object *obj,wchar_t p)

{
  wchar_t local_18;
  wchar_t local_14;
  wchar_t q;
  wchar_t p_local;
  object *obj_local;
  
  local_18 = L'\0';
  if (obj->activation == (activation *)0x0) {
    if (obj->kind->power != L'\0') {
      local_18 = obj->kind->power;
    }
  }
  else {
    local_18 = obj->activation->power;
  }
  local_14 = p;
  if (local_18 != L'\0') {
    local_14 = local_18 + p;
    log_obj("Add %d power for item activation, total is %d\n",(ulong)(uint)local_18,
            (ulong)(uint)local_14);
  }
  return local_14;
}

Assistant:

static int effects_power(const struct object *obj, int p)
{
	int q = 0;

	if (obj->activation) {
		q = obj->activation->power;
	} else if (obj->kind->power) {
		q = obj->kind->power;
	}

	if (q) {
		p += q;
		log_obj("Add %d power for item activation, total is %d\n",
			q, p);
	}
	return p;
}